

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::DeleteBorderRoutersInNetworks
          (Registry *this,StringArray *aAliases,StringArray *aUnresolved)

{
  size_t __n;
  size_t sVar1;
  size_t sVar2;
  pointer pNVar3;
  pointer pBVar4;
  StringArray *pSVar5;
  Status SVar6;
  char cVar7;
  int iVar8;
  Status SVar9;
  pointer pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias;
  pointer pbVar11;
  pointer pNVar12;
  long lVar13;
  Status unaff_R12B;
  pointer pbVar14;
  BorderRouter *br_1;
  pointer pBVar15;
  bool bVar16;
  bool bVar17;
  NetworkArray nwks;
  BorderRouterArray brs;
  Network current;
  BorderRouter br;
  NetworkArray local_288;
  ulong local_270;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  local_268;
  StringArray *local_250;
  StringArray *local_248;
  void *local_240;
  pointer local_238;
  void *local_230;
  void *local_228;
  size_t local_220;
  Network local_218;
  BorderRouter local_1b8;
  
  local_288.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Network::Network(&local_218);
  sVar2 = DAT_002bdd68;
  sVar1 = DAT_002bdd48;
  pbVar11 = (aAliases->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar14 = (aAliases->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  bVar17 = pbVar11 == pbVar14;
  local_250 = aUnresolved;
  local_248 = aAliases;
  if (!bVar17) {
    local_228 = (anonymous_namespace)::ALIAS_THIS_abi_cxx11_;
    local_230 = (anonymous_namespace)::ALIAS_ALL_abi_cxx11_;
    local_220 = DAT_002bdd88;
    local_240 = (anonymous_namespace)::ALIAS_OTHER_abi_cxx11_;
    local_270 = (long)pbVar14 - (long)pbVar11;
    local_238 = pbVar14;
    do {
      __n = pbVar11->_M_string_length;
      if ((__n == sVar1) &&
         ((__n == 0 || (iVar8 = bcmp((pbVar11->_M_dataplus)._M_p,local_228,__n), iVar8 == 0)))) {
        bVar16 = false;
        unaff_R12B = kRestricted;
      }
      else if ((__n == sVar2) &&
              ((__n == 0 || (iVar8 = bcmp((pbVar11->_M_dataplus)._M_p,local_230,__n), iVar8 == 0))))
      {
        bVar16 = false;
        unaff_R12B = kDataInvalid;
      }
      else if (__n == local_220) {
        if (__n == 0) {
          if (local_270 < 0x21) goto LAB_001a3b02;
        }
        else {
          bVar16 = local_270 < 0x21;
          iVar8 = bcmp((pbVar11->_M_dataplus)._M_p,local_240,__n);
          pbVar14 = local_238;
          if (iVar8 != 0 || bVar16) goto LAB_001a3b02;
        }
        unaff_R12B = kDataInvalid;
        bVar16 = false;
      }
      else {
LAB_001a3b02:
        bVar16 = true;
      }
      if (!bVar16) break;
      pbVar11 = pbVar11 + 1;
      bVar17 = pbVar11 == pbVar14;
    } while (!bVar17);
  }
  pSVar5 = local_248;
  SVar6 = unaff_R12B;
  if ((!bVar17) ||
     (SVar6 = GetNetworksByAliases(this,local_248,&local_288,local_250), SVar6 != kSuccess))
  goto LAB_001a3c5e;
  pbVar11 = (pSVar5->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  sVar1 = pbVar11->_M_string_length;
  if (((sVar1 != DAT_002bdd88) ||
      ((sVar1 != 0 &&
       (iVar8 = bcmp((pbVar11->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_,sVar1
                    ), iVar8 != 0)))) &&
     (SVar6 = GetCurrentNetwork(this,&local_218), SVar6 != kSuccess)) goto LAB_001a3c5e;
  pNVar3 = local_288.
           super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_218.mId.mId == 0xffffffff) {
    SVar9 = kSuccess;
  }
  else {
    lVar13 = ((long)local_288.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_288.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555 >> 2;
    pNVar10 = local_288.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < lVar13) {
      pNVar10 = local_288.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar13 * 4;
      lVar13 = lVar13 + 1;
      pNVar12 = local_288.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_start + 2;
      do {
        if (pNVar12[-2].mId.mId == local_218.mId.mId) {
          pNVar12 = pNVar12 + -2;
          goto LAB_001a3cc0;
        }
        if (pNVar12[-1].mId.mId == local_218.mId.mId) {
          pNVar12 = pNVar12 + -1;
          goto LAB_001a3cc0;
        }
        if ((pNVar12->mId).mId == local_218.mId.mId) goto LAB_001a3cc0;
        if (pNVar12[1].mId.mId == local_218.mId.mId) {
          pNVar12 = pNVar12 + 1;
          goto LAB_001a3cc0;
        }
        lVar13 = lVar13 + -1;
        pNVar12 = pNVar12 + 4;
      } while (1 < lVar13);
    }
    lVar13 = ((long)local_288.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar10 >> 5) *
             -0x5555555555555555;
    if (lVar13 == 1) {
LAB_001a3c50:
      pNVar12 = pNVar10;
      if ((pNVar10->mId).mId != local_218.mId.mId) {
        pNVar12 = local_288.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (lVar13 == 2) {
LAB_001a3c48:
      pNVar12 = pNVar10;
      if ((pNVar10->mId).mId != local_218.mId.mId) {
        pNVar10 = pNVar10 + 1;
        goto LAB_001a3c50;
      }
    }
    else {
      pNVar12 = local_288.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((lVar13 == 3) && (pNVar12 = pNVar10, (pNVar10->mId).mId != local_218.mId.mId)) {
        pNVar10 = pNVar10 + 1;
        goto LAB_001a3c48;
      }
    }
LAB_001a3cc0:
    SVar9 = (pNVar12 !=
            local_288.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish) * '\x05';
    SVar6 = SVar9;
    if (pNVar12 !=
        local_288.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001a3c5e;
  }
  iVar8 = 0xb;
  pNVar10 = local_288.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_288.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_288.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_268.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_268.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_268.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      BorderRouter::BorderRouter(&local_1b8);
      local_1b8.mNetworkId.mId = (pNVar10->mId).mId;
      iVar8 = (*this->mStorage->_vptr_PersistentStorage[0x17])(this->mStorage,&local_1b8,&local_268)
      ;
      pBVar4 = local_268.
               super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      cVar7 = (char)iVar8;
      SVar9 = (cVar7 != '\0') << 2;
      if (cVar7 == '\x01') {
        SVar9 = kNotFound;
      }
      if (cVar7 == '\0') {
        iVar8 = 0xf;
        pBVar15 = local_268.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_268.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_268.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar17 = true;
          SVar9 = kSuccess;
        }
        else {
          do {
            SVar9 = DeleteBorderRouterById(this,&pBVar15->mId);
            bVar17 = SVar9 == kSuccess;
            if (!bVar17) {
              iVar8 = 6;
              break;
            }
            pBVar15 = pBVar15 + 1;
          } while (pBVar15 != pBVar4);
        }
        if (bVar17) {
          SVar9 = DropDomainIfEmpty(this,&pNVar10->mDomainId);
          iVar8 = 6;
          if (SVar9 == kSuccess) {
            iVar8 = 0;
          }
        }
      }
      else {
        iVar8 = 6;
      }
      local_1b8._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b7120;
      BorderAgent::~BorderAgent(&local_1b8.mAgent);
      std::
      vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ::~vector(&local_268);
      if (iVar8 != 0) goto LAB_001a3e05;
      pNVar10 = pNVar10 + 1;
    } while (pNVar10 != pNVar3);
    iVar8 = 0xb;
  }
LAB_001a3e05:
  if ((iVar8 == 0xb) || (SVar6 = unaff_R12B, iVar8 == 6)) {
    SVar6 = SVar9;
  }
LAB_001a3c5e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.mMlp._M_dataplus._M_p != &local_218.mMlp.field_2) {
    operator_delete(local_218.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.mName._M_dataplus._M_p != &local_218.mName.field_2) {
    operator_delete(local_218.mName._M_dataplus._M_p);
  }
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&local_288);
  return SVar6;
}

Assistant:

Registry::Status Registry::DeleteBorderRoutersInNetworks(const StringArray &aAliases, StringArray &aUnresolved)
{
    Registry::Status status;
    NetworkArray     nwks;
    Network          current;

    // Check aAliases acceptable
    for (const auto &alias : aAliases)
    {
        if (alias == ALIAS_THIS)
        {
            return Registry::Status::kRestricted;
        }
        if (alias == ALIAS_ALL || (alias == ALIAS_OTHER && aAliases.size() > 1))
        {
            return Registry::Status::kDataInvalid;
        }
    }

    VerifyOrExit((status = GetNetworksByAliases(aAliases, nwks, aUnresolved)) == Registry::Status::kSuccess);

    // Processing explicit network aAliases
    if (aAliases[0] != ALIAS_OTHER)
    {
        VerifyOrExit((status = GetCurrentNetwork(current)) == Registry::Status::kSuccess);
    }

    if (current.mId.mId != EMPTY_ID)
    {
        auto found =
            std::find_if(nwks.begin(), nwks.end(), [&](const Network &a) { return a.mId.mId == current.mId.mId; });
        VerifyOrExit(found == nwks.end(), status = Registry::Status::kRestricted);
    }

    for (const auto &nwk : nwks)
    {
        BorderRouterArray brs;
        BorderRouter      br;

        br.mNetworkId = nwk.mId;
        VerifyOrExit((status = MapStatus(mStorage->Lookup(br, brs))) == Registry::Status::kSuccess);
        for (auto &&br : brs)
        {
            VerifyOrExit((status = DeleteBorderRouterById(br.mId)) == Registry::Status::kSuccess);
        }

        VerifyOrExit((status = DropDomainIfEmpty(nwk.mDomainId)) == Registry::Status::kSuccess);
    }
exit:
    return status;
}